

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

int __thiscall TadsHttpServerThread::process_request(TadsHttpServerThread *this)

{
  int iVar1;
  StringRef *this_00;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  void *__buf;
  TadsHttpServerThread *this_01;
  OS_Event *hdr_list_00;
  ssize_t sVar8;
  __off_t __length;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length_00;
  __off_t __length_01;
  __off_t __length_02;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_02;
  __off_t _Var9;
  TadsServerThread *in_RDI;
  long nlofs;
  long nllen;
  long chunkrem;
  long ralen;
  long chunklen;
  long nlofs_1;
  long initlen;
  long hclval;
  char *hte;
  char *hcl;
  long hbodylen;
  int overflow;
  StringRef *body;
  char *hbody;
  char *p;
  long ofs;
  int ok;
  size_t res_name_len;
  char *resource_name;
  size_t verb_len;
  char *verb;
  TadsHttpRequest *req;
  TadsHttpRequestHeader *hdr_tail;
  TadsHttpRequestHeader *hdr_list;
  StringRef *hdrs;
  int in_stack_00001e70;
  int in_stack_00001e74;
  long in_stack_00001e78;
  StringRef *in_stack_00001e80;
  TadsHttpServerThread *in_stack_00001e88;
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  TadsHttpRequestHeader *in_stack_fffffffffffffe48;
  StringRef *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  StringRef *in_stack_fffffffffffffe60;
  StringRef *in_stack_fffffffffffffe68;
  TadsHttpServerThread *in_stack_fffffffffffffe70;
  TadsHttpRequestHeader **in_stack_fffffffffffffe78;
  TadsHttpRequestHeader **in_stack_fffffffffffffe80;
  StringRef *body_00;
  StringRef *pSVar10;
  undefined4 in_stack_fffffffffffffea0;
  void *local_c0;
  void *local_a8;
  int local_9c;
  StringRef *local_98;
  char *local_80;
  int local_74;
  OS_Event *local_70;
  size_t local_68;
  TadsHttpRequest *local_60;
  TadsHttpServerThread *local_58;
  
  this_00 = (StringRef *)operator_new(0x28);
  StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (long)in_stack_fffffffffffffe38);
  local_74 = 0;
  local_98 = (StringRef *)0x0;
  local_9c = 0;
  iVar1 = read_to_nl(in_stack_00001e88,in_stack_00001e80,in_stack_00001e78,in_stack_00001e74,
                     in_stack_00001e70);
  lVar2 = (long)iVar1;
  if (-1 < lVar2) {
    StringRef::get(this_00);
    lVar3 = StringRef::getlen(this_00);
    local_a8 = (void *)(lVar3 - lVar2);
    StringRef::truncate(this_00,(char *)(lVar2 + -2),__length);
    StringRef::get(this_00);
    parse_tok((char **)in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->name,
              (size_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    parse_tok((char **)in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->name,
              (size_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    TadsHttpRequestHeader::parse_headers
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),in_stack_fffffffffffffe68,
               (long)in_stack_fffffffffffffe60);
    pcVar4 = TadsHttpRequestHeader::find
                       (in_stack_fffffffffffffe48,
                        (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    pcVar5 = TadsHttpRequestHeader::find
                       (in_stack_fffffffffffffe48,
                        (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if ((pcVar4 != (char *)0x0) || (pcVar5 != (char *)0x0)) {
      if (pcVar4 == (char *)0x0) {
        iVar1 = stricmp((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
        if (iVar1 == 0) {
          local_98 = (StringRef *)operator_new(0x28);
          StringRef::StringRef
                    ((StringRef *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (long)in_stack_fffffffffffffe38);
          if (local_a8 != (void *)0x0) {
            StringRef::append(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                              (long)in_stack_fffffffffffffe50);
          }
          local_80 = (char *)0x0;
          while( true ) {
            iVar1 = read_to_nl(in_stack_00001e88,in_stack_00001e80,in_stack_00001e78,
                               in_stack_00001e74,in_stack_00001e70);
            lVar2 = (long)iVar1;
            if (lVar2 < 0) break;
            pcVar4 = StringRef::get(local_98);
            lVar3 = strtol(pcVar4 + (long)local_80,(char **)0x0,0x10);
            lVar6 = StringRef::getlen(local_98);
            lVar6 = lVar6 - lVar2;
            _Var9 = extraout_RDX;
            if (0 < lVar6) {
              pcVar4 = StringRef::get(local_98);
              pcVar5 = StringRef::get(local_98);
              lVar7 = StringRef::getlen(local_98);
              memmove(pcVar4 + (long)local_80,pcVar5 + lVar2,lVar7 - lVar2);
              _Var9 = extraout_RDX_00;
            }
            StringRef::truncate(local_98,local_80 + lVar6,_Var9);
            if (lVar3 == 0) {
              iVar1 = read_to_nl(in_stack_00001e88,in_stack_00001e80,in_stack_00001e78,
                                 in_stack_00001e74,in_stack_00001e70);
              if (-1 < (long)iVar1) {
                _Var9 = extraout_RDX_01;
                if ((long)(local_80 + 2) < (long)iVar1) {
                  TadsHttpRequestHeader::parse_headers
                            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                             in_stack_fffffffffffffe68,(long)in_stack_fffffffffffffe60);
                  _Var9 = extraout_RDX_02;
                }
                StringRef::truncate(local_98,local_80,_Var9);
                goto LAB_0026050f;
              }
              break;
            }
            if (((in_RDI[1].super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.
                  super___atomic_base<long>._M_i != 0) && (local_9c == 0)) &&
               (lVar2 = StringRef::getlen(local_98),
               in_RDI[1].super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.
               super___atomic_base<long>._M_i < lVar2 + lVar3)) {
              local_9c = 1;
            }
            lVar2 = lVar3 - lVar6;
            if (lVar2 + 2 < 1) {
              local_80 = local_80 + lVar3;
              if (lVar6 - lVar3 < 2) {
                __buf = (void *)(2 - (lVar6 - lVar3));
                StringRef::ensure(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
                pcVar4 = StringRef::getend(local_98);
                sVar8 = TadsServerThread::read(in_RDI,(int)pcVar4,__buf,(size_t)__buf);
                if (sVar8 < 0) {
                  send_simple(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                              (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                  break;
                }
              }
              if (2 < lVar6 - lVar3) {
                pcVar4 = StringRef::get(local_98);
                pcVar5 = StringRef::get(local_98);
                memmove(pcVar4 + (long)local_80,pcVar5 + (long)local_80 + 2,(lVar6 - lVar3) - 2);
                lVar2 = StringRef::getlen(local_98);
                StringRef::truncate(local_98,(char *)(lVar2 + -2),__length_00);
              }
            }
            else if (local_9c == 0) {
              StringRef::ensure(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
              pcVar4 = StringRef::getend(local_98);
              sVar8 = TadsServerThread::read(in_RDI,(int)pcVar4,(void *)(lVar2 + 2),lVar2 + 2);
              if (sVar8 < 0) {
                send_simple(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                            (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                break;
              }
              StringRef::addlen(local_98,lVar2 + 2);
              pcVar4 = StringRef::getend(local_98);
              if (*(short *)(pcVar4 + -2) != 0xa0d) {
                send_simple(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                            (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                break;
              }
              lVar2 = StringRef::getlen(local_98);
              local_80 = (char *)(lVar2 + -2);
              StringRef::truncate(local_98,local_80,__length_02);
            }
            else {
              sVar8 = TadsServerThread::read(in_RDI,0,(void *)0x0,lVar2 + 2);
              if (sVar8 < 0) break;
              StringRef::truncate(local_98,(char *)0x0,__length_01);
              local_80 = (char *)0x0;
            }
          }
        }
        else {
          send_simple(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                      (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        goto LAB_00260715;
      }
      local_c0 = (void *)atol(pcVar4);
      if (local_c0 != (void *)0x0) {
        if ((in_RDI[1].super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.
             super___atomic_base<long>._M_i == 0) ||
           ((long)local_c0 <=
            in_RDI[1].super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.
            super___atomic_base<long>._M_i)) {
          local_98 = (StringRef *)operator_new(0x28);
          StringRef::StringRef
                    ((StringRef *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (long)in_stack_fffffffffffffe38);
          if (local_a8 != (void *)0x0) {
            if ((long)local_c0 < (long)local_a8) {
              local_a8 = local_c0;
            }
            StringRef::append(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                              (long)in_stack_fffffffffffffe50);
            local_c0 = (void *)((long)local_c0 - (long)local_a8);
          }
          if (local_c0 != (void *)0x0) {
            pcVar4 = StringRef::getend(local_98);
            sVar8 = TadsServerThread::read(in_RDI,(int)pcVar4,local_c0,(size_t)local_c0);
            if (sVar8 < 0) {
              send_simple(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                          (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              goto LAB_00260715;
            }
          }
          StringRef::addlen(local_98,(long)local_c0);
        }
        else {
          local_9c = 1;
          TadsServerThread::read(in_RDI,0,(void *)0x0,(size_t)local_c0);
        }
      }
LAB_0026050f:
      if ((local_9c != 0) && (local_98 != (StringRef *)0x0)) {
        CVmRefCntObj::release_ref
                  ((CVmRefCntObj *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        local_98 = (StringRef *)0x0;
      }
    }
    this_01 = (TadsHttpServerThread *)operator_new(0x70);
    body_00 = (StringRef *)0x0;
    pSVar10 = local_98;
    in_stack_fffffffffffffe40 = local_9c;
    hdr_list_00 = TadsListenerThread::get_shutdown_evt(in_RDI->listener);
    iVar1 = (int)this_00;
    TadsHttpRequest::TadsHttpRequest
              (local_60,local_58,(char *)this_01,(size_t)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60,(TadsHttpRequestHeader *)hdr_list_00,body_00,(int)pSVar10,
               (char *)CONCAT44(in_stack_fffffffffffffe40,in_stack_fffffffffffffea0),local_68,
               local_70);
    sVar8 = TadsMessageQueue::send
                      ((TadsMessageQueue *)
                       in_RDI[1].super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.
                       _vptr_CVmRefCntObj,(int)this_01,(void *)0xffffffffffffffff,(size_t)this_01,
                       iVar1);
    if ((int)sVar8 == 0) {
      iVar1 = TadsMessageQueue::is_quitting
                        ((TadsMessageQueue *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      if (iVar1 == 0) {
        send_simple(this_01,(char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                    (char *)hdr_list_00);
      }
      else {
        send_simple(this_01,(char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                    (char *)hdr_list_00);
      }
    }
    CVmRefCntObj::release_ref
              ((CVmRefCntObj *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_74 = 1;
  }
LAB_00260715:
  if (local_98 != (StringRef *)0x0) {
    CVmRefCntObj::release_ref
              ((CVmRefCntObj *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  CVmRefCntObj::release_ref
            ((CVmRefCntObj *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  return local_74;
}

Assistant:

int TadsHttpServerThread::process_request()
{
    StringRef *hdrs = new StringRef(1024);
    TadsHttpRequestHeader *hdr_list = 0, *hdr_tail = 0;
    TadsHttpRequest *req = 0;
    char *verb;
    size_t verb_len;
    char *resource_name;
    size_t res_name_len;
    int ok = FALSE;
    long ofs;
    char *p, *hbody;
    StringRef *body = 0;
    int overflow = FALSE;
    long hbodylen;
    const char *hcl, *hte;             /* content-length, transfer-encoding */

    /* 
     *   Read the header.  We read data into our buffer until we find a
     *   double CR-LF sequence, indicating the end of the header.  
     */
    if ((ofs = read_to_nl(hdrs, 0, 0, 4)) < 0)
        goto done;

    /* the body, if any, starts after the double line break */
    hbody = hdrs->get() + ofs;
    hbodylen = hdrs->getlen() - ofs;

    /* truncate the headers to the CR-LF-CR-LF sequence */
    hdrs->truncate(ofs - 2);

    /*
     *   Parse the main verb in the header - get the method and the resource
     *   ID.  The format is:
     *   
     *.     <space>* VERB <space>+ RESOURCE <space>+ HTTP-VERSION <CRLF>
     */
    p = hdrs->get();
    parse_tok(p, verb, verb_len);
    parse_tok(p, resource_name, res_name_len);

    /* now parse the remaining headers */
    TadsHttpRequestHeader::parse_headers(hdr_list, hdr_tail, FALSE, hdrs, 0);

    /* 
     *   Check to see if there's a message body.  There is if there's a
     *   content-length or transfer-encoding header.
     */
    hcl = hdr_list->find("content-length");
    hte = hdr_list->find("transfer-encoding");
    if (hcl != 0 || hte != 0)
    {
        /* 
         *   There's a content body.  If there's a content-length field,
         *   pre-allocate a chunk of memory, then read the number of bytes
         *   indicated.  If it's a chunked transfer, read it in pieces.  
         */
        if (hcl != 0)
        {
            /* get the length */
            long hclval = atol(hcl);

            /* if it's non-zero, read the content */
            if (hclval != 0)
            {
                /* if this exceeds the size limit, abort */
                if (upload_limit != 0 && hclval > upload_limit)
                {
                    /* set the overflow flag, discard the input, and abort */
                    overflow = TRUE;
                    read(0, 0, hclval, 5000);
                    goto done_with_upload;
                }

                /* allocate the buffer; it's initially empty */
                body = new StringRef(hclval);

                /* copy any portion of the body we've already read */
                if (hbodylen != 0)
                {
                    /* limit this to the declared size */
                    if (hbodylen > hclval)
                        hbodylen = hclval;

                    /* copy the data */
                    body->append(hbody, hbodylen);

                    /* deduct the remaining size */
                    hclval -= hbodylen;
                }

                /* read the body */
                if (hclval != 0
                    && read(body->getend(), hclval, hclval, 5000) < 0)
                {
                    send_simple(S_http_400, "text/html",
                                "Error receiving request message body");
                    goto done;
                }

                /* set the body length */
                body->addlen(hclval);
            }
        }
        else if (stricmp(hte, "chunked") == 0)
        {
            /* set up a string buffer for the content */
            const long initlen = 32000;
            body = new StringRef(hbodylen > initlen ? hbodylen : initlen);

            /* if we've already read some body text, copy it to the buffer */
            if (hbodylen != 0)
                body->append(hbody, hbodylen);
            
            /* keep going until we reach the end marker */
            for (ofs = 0 ; ; )
            {
                /* read to the first newline */
                long nlofs = read_to_nl(body, ofs, 0, 2);
                if (nlofs < 0)
                    goto done;

                /* get the chunk length */
                long chunklen = strtol(body->get() + ofs, 0, 16);

                /* 
                 *   We're done with the chunk length.  Move any read-ahead
                 *   content down in memory so that it directly abuts the
                 *   preceding chunk, so that when we're done we'll have the
                 *   content assembled into one contiguous piece.  
                 */
                long ralen = body->getlen() - nlofs;
                if (ralen > 0)
                    memmove(body->get() + ofs, body->get() + nlofs,
                            body->getlen() - nlofs);

                /* stop at the end of the read-ahead portion */
                body->truncate(ofs + ralen);

                /* if the chunk length is zero, we're done */
                if (chunklen == 0)
                    break;

                /* check if this would overflow our upload size limit */
                if (upload_limit != 0
                    && !overflow
                    && body->getlen() + chunklen > upload_limit)
                {
                    /* flag the overflow, but keep reading the content */
                    overflow = TRUE;
                }

                /* 
                 *   figure the remaining read size for this chunk, after any
                 *   read-ahead portion 
                 */
                long chunkrem = chunklen - ralen;

                /* 
                 *   if we've already overflowed, read and discard the chunk;
                 *   otherwise read it into our buffer 
                 */
                if (chunkrem + 2 <= 0)
                {
                    /* 
                     *   We've already read ahead by enough to cover the next
                     *   chunk and the newline at the end.  Go in and delete
                     *   the newline (or as much of it as exists).  Start by
                     *   getting the offset of the newline: it's just after
                     *   the current chunk, which starts at 'ofs' and runs
                     *   for 'chunklen'.  
                     */
                    nlofs = ofs + chunklen;

                    /* 
                     *   if we haven't yet read the full newline sequence, do
                     *   so now
                     */
                    if (ralen - chunklen < 2)
                    {
                        long nllen = 2 - (ralen - chunklen);
                        body->ensure(nllen);
                        if (read(body->getend(), nllen, nllen, 30000) < 0)
                        {
                            send_simple(S_http_400, "text/html",
                                        "Error receiving request message chunk");
                            goto done;
                        }
                    }

                    /* 
                     *   if there's anything after the newline, move it down
                     *   to overwrite the newline 
                     */
                    if (ralen - chunklen > 2)
                    {
                        /* move the bytes */
                        memmove(body->get() + nlofs,
                                body->get() + nlofs + 2,
                                ralen - chunklen - 2);

                        /* adjust the size for the closed gap */
                        body->truncate(body->getlen() - 2);
                    }

                    /* resume from after the newline */
                    ofs = nlofs;
                }
                else if (overflow)
                {
                    /* overflow - discard the chunk size (plus the CR-LF) */
                    if (read(0, 0, chunkrem+2, 30000) < 0)
                        goto done;

                    /* clear the buffer */
                    body->truncate(0);
                    ofs = 0;
                }
                else
                {
                    /* ensure the buffer is big enough */
                    body->ensure(chunkrem + 2);

                    /* read the chunk, plus the CR-LF that follows */
                    if (read(body->getend(),
                             chunkrem + 2, chunkrem + 2, 30000) < 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error receiving request message chunk");
                        goto done;
                    }

                    /* count the amount we just read in the buffer length */
                    body->addlen(chunkrem + 2);

                    /* verify that the last two bytes are indeed CR-LF */
                    if (memcmp(body->getend() - 2, "\r\n", 2) != 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error in request message chunk");
                        goto done;
                    }

                    /* 
                     *   move past the chunk for the next read, minus the
                     *   CR-LF that follows the chunk - that isn't part of
                     *   the data, but just part of the protocol 
                     */
                    ofs = body->getlen() - 2;
                    body->truncate(ofs);
                }
            }

            /* 
             *   Read to the closing blank line.  We've just passed one
             *   newline, following the '0' end length marker, so we're in
             *   state 2.  We could have either another newline following, or
             *   "trailers" (more headers, following the content body).
             */
            long nlofs = read_to_nl(body, ofs, 2, 4);
            if (nlofs < 0)
                goto done;

            /* 
             *   if we have more than just the closing blank line, we have
             *   trailers - append them to the headers 
             */
            if (nlofs > ofs + 2)
            {
                TadsHttpRequestHeader::parse_headers(
                    hdr_list, hdr_tail, TRUE, body, ofs);
            }

            /* 
             *   the trailers (if any) and closing newline aren't part of the
             *   content - clip them out of the body 
             */
            body->truncate(ofs);
        }
        else
        {
            /* 
             *   Other combinations of these headers are illegal.  Send an
             *   error and abort. 
             */
            send_simple(S_http_400, "text/html",
                        "<html><title>Bad Request</title>"
                        "<h1>Bad Request</h1>"
                        "This server does not accept the specified "
                        "transfer-encoding.");
            goto done;
        }

    done_with_upload:
        /* done with the upload - check for overflow */
        if (overflow)
        {
            /* release the body, if present */
            if (body != 0)
            {
                body->release_ref();
                body = 0;
            }
        }
    }

    /* create a message object for the request */
    req = new TadsHttpRequest(
        this, verb, verb_len, hdrs, hdr_list, body, overflow,
        resource_name, res_name_len,
        listener->get_shutdown_evt());

    /* we've handed over the header list to the request */
    hdr_list = 0;
    
    /* send it to the main thread, and wait for the reply */
    if (queue->send(req, OS_FOREVER))
    {
        /* 
         *   success - the server will already have sent the reply, so we're
         *   done 
         */
    }
    else if (queue->is_quitting())
    {
        /* failed due to server shutdown */
        send_simple(S_http_503, "text/html", S_http_503_quitting_body);
    }
    else
    {
        /* 'send' failed - return an internal server error */
        send_simple(S_http_500, "text/html", S_http_500_body);
    }
    
    /* we're done with the request */
    req->release_ref();

    /* success */
    ok = TRUE;

done:
    /* release the message body buffer */
    if (body != 0)
        body->release_ref();

    /* release the header buffer */
    hdrs->release_ref();

    /* delete the header list */
    if (hdr_list != 0)
        delete hdr_list;

    /* return the success/failure indication */
    return ok;
}